

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O2

char * SearchStdResConnTable(char *key)

{
  StdResConnTableEntry_t *pSVar1;
  uint uVar2;
  int iVar3;
  _StdResConnTableEntry **pp_Var4;
  
  uVar2 = HashInStdResTbl(key);
  pp_Var4 = StdResTblBucket + uVar2;
  while( true ) {
    pSVar1 = *pp_Var4;
    if (pSVar1 == (StdResConnTableEntry_t *)0x0) {
      return (char *)0x0;
    }
    iVar3 = strcmp(key,pSVar1->key);
    if (iVar3 < 1) break;
    pp_Var4 = &pSVar1->next;
  }
  if (iVar3 != 0) {
    return (char *)0x0;
  }
  return pSVar1->value;
}

Assistant:

char *SearchStdResConnTable(char *key) {
   int r = 0;
   StdResConnTableEntry_t *t;

   t = StdResTblBucket[HashInStdResTbl(key)];

   while (t && (r = strcmp(key, t->key)) > 0) {
      t = t->next;
   }

   return (t ? (r ? NULL : t->value) : NULL);
}